

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeglobals.cpp
# Opt level: O1

QString * __thiscall
QMakeGlobals::shadowedPath(QString *__return_storage_ptr__,QMakeGlobals *this,QString *fileName)

{
  long lVar1;
  Data *pDVar2;
  char cVar3;
  long in_FS_OFFSET;
  QArrayData *local_68;
  char16_t *pcStack_60;
  qsizetype local_58;
  QStringBuilder<const_QString_&,_QString> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->source_root).d.size == 0) {
    pDVar2 = (fileName->d).d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (fileName->d).ptr;
    (__return_storage_ptr__->d).size = (fileName->d).size;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    cVar3 = QString::startsWith((QString *)fileName,(int)this + 0x178);
    if ((cVar3 == '\0') ||
       ((lVar1 = (this->source_root).d.size, (fileName->d).size != lVar1 &&
        ((fileName->d).ptr[lVar1] != L'/')))) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        return __return_storage_ptr__;
      }
      goto LAB_0028a5cb;
    }
    QString::mid((longlong)&local_68,(longlong)fileName);
    local_48.b.d.size = local_58;
    local_48.b.d.ptr = pcStack_60;
    local_48.b.d.d = (Data *)local_68;
    local_68 = (QArrayData *)0x0;
    pcStack_60 = (char16_t *)0x0;
    local_58 = 0;
    local_48.a = &this->build_root;
    QStringBuilder<const_QString_&,_QString>::convertTo<QString>(__return_storage_ptr__,&local_48);
    if (&(local_48.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.b.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_68,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
LAB_0028a5cb:
  __stack_chk_fail();
}

Assistant:

QString QMakeGlobals::shadowedPath(const QString &fileName) const
{
    if (source_root.isEmpty())
        return fileName;
    if (fileName.startsWith(source_root)
        && (fileName.size() == source_root.size()
            || fileName.at(source_root.size()) == QLatin1Char('/'))) {
        return build_root + fileName.mid(source_root.size());
    }
    return QString();
}